

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobalObject.cpp
# Opt level: O2

GlobalObject * Js::GlobalObject::New(ScriptContext *scriptContext)

{
  SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false> *typeHandler;
  DynamicType *type;
  Recycler *alloc;
  GlobalObject *this;
  RecyclerWeakReference<Js::DynamicObject> *instance;
  undefined1 local_50 [8];
  TrackAllocData data;
  
  typeHandler = SimpleDictionaryTypeHandlerBase<unsigned_short,_const_Js::PropertyRecord_*,_false>::
                New(scriptContext->recycler,0x34,0x34,0x68,false,false);
  type = DynamicType::New(scriptContext,TypeIds_GlobalObject,(RecyclableObject *)0x0,
                          (JavascriptMethod)0x0,&typeHandler->super_DynamicTypeHandler,false,false);
  local_50 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x1a0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_64c0234;
  data.filename._0_4_ = 0x1b;
  alloc = Memory::Recycler::TrackAllocInfo(scriptContext->recycler,(TrackAllocData *)local_50);
  this = (GlobalObject *)new<Memory::Recycler>(0x68,alloc,0x37ff80,0);
  GlobalObject(this,type,scriptContext);
  instance = Memory::Recycler::CreateWeakReferenceHandle<Js::DynamicObject>
                       (scriptContext->recycler,(DynamicObject *)this);
  DynamicTypeHandler::SetSingletonInstanceIfNeeded(&typeHandler->super_DynamicTypeHandler,instance);
  return this;
}

Assistant:

GlobalObject * GlobalObject::New(ScriptContext * scriptContext)
    {
        SimpleDictionaryTypeHandler* globalTypeHandler = SimpleDictionaryTypeHandler::New(
            scriptContext->GetRecycler(), InitialCapacity, InlineSlotCapacity, sizeof(Js::GlobalObject));

        DynamicType* globalType = DynamicType::New(
            scriptContext, TypeIds_GlobalObject, nullptr, nullptr, globalTypeHandler);

        GlobalObject* globalObject = RecyclerNewPlus(scriptContext->GetRecycler(),
            sizeof(Var) * InlineSlotCapacity, GlobalObject, globalType, scriptContext);

#if ENABLE_FIXED_FIELDS
        globalTypeHandler->SetSingletonInstanceIfNeeded(scriptContext->GetRecycler()->CreateWeakReferenceHandle<DynamicObject>(globalObject));
#endif

        return globalObject;
    }